

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>::
streamReconstructedExpression
          (BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&> *this,ostream *os)

{
  string *in_R9;
  StringRef op;
  data_view local_68 [2];
  string *local_48;
  char *pcStack_40;
  data_view local_38 [2];
  ostream *local_18;
  ostream *os_local;
  BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<protozero::data_view>(local_38);
  local_48 = (string *)(this->m_op).m_start;
  pcStack_40 = (char *)(this->m_op).m_size;
  Detail::stringify<protozero::data_view>(local_68);
  op.m_size = (size_type)local_68;
  op.m_start = pcStack_40;
  formatReconstructedExpression((Catch *)os,(ostream *)local_38,local_48,op,in_R9);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }